

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserUtils.cpp
# Opt level: O3

unsigned_short
GeneratedSaxParser::Utils::toInteger<unsigned_short,false>(ParserChar *buffer,bool *failed)

{
  byte bVar1;
  unsigned_short uVar2;
  byte bVar3;
  ParserChar *s;
  byte *pbVar4;
  bool bVar5;
  
  bVar5 = true;
  if ((buffer != (ParserChar *)0x0) && (bVar3 = *buffer, bVar3 != 0)) {
    pbVar4 = (byte *)(buffer + 1);
    do {
      if ((0x20 < bVar3) || ((0x100002600U >> ((ulong)bVar3 & 0x3f) & 1) == 0)) {
        bVar1 = bVar3 - 0x3a;
        uVar2 = 0;
        if (0xf5 < bVar1) goto LAB_0080c571;
        goto LAB_0080c591;
      }
      bVar3 = *pbVar4;
      pbVar4 = pbVar4 + 1;
    } while (bVar3 != 0);
  }
  uVar2 = 0;
  goto LAB_0080c564;
  while (pbVar4 = pbVar4 + 1, (byte)(bVar3 - 0x30) < 10) {
LAB_0080c571:
    uVar2 = (uVar2 * 10 + (ushort)bVar3) - 0x30;
    bVar3 = *pbVar4;
    if (bVar3 == 0) {
      bVar5 = false;
      goto LAB_0080c564;
    }
  }
LAB_0080c591:
  bVar5 = bVar1 < 0xf6;
LAB_0080c564:
  *failed = bVar5;
  return uVar2;
}

Assistant:

IntegerType Utils::toInteger(const ParserChar* buffer, bool& failed)
	{
		const ParserChar* s = buffer;
		if ( !s )
		{
			failed = true;
			return 0;
		}

		if ( *s == '\0' )
		{
			failed = true;
			return 0;
		}

		// Skip leading white spaces
		while ( isWhiteSpace(*s) )
		{
			++s;
			if ( *s == '\0' )
			{
				failed = true;
				return 0;
			}
		}

		IntegerType value = 0;
		IntegerType sign = 1;
		if ( signedInteger )
		{
			if (*s == '-')
			{
				++s;
				sign = -1;
			}
			else if (*s == '+')
			{
				++s;
			}
		}

		bool digitFound = false;
		while (true)
		{
			if ( *s == '\0' )
			{
				failed = false;
				return value * sign;
			}

			if ( isdigit(*s) )
			{
				value = value * 10 + (*s - '0');
				digitFound = true;
			}
			else
			{
				break;
			}
			++s;
		}
		if ( digitFound )
		{
			failed = false;
			if ( signedInteger )
				return value * sign;
			else
				return value;
		}
		else
		{
			failed = true;
			return 0;
		}
	}